

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.cpp
# Opt level: O0

int ztransform(uint8_t *msg,uint32_t *h)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int local_148;
  int local_144;
  int j;
  int i;
  uint32_t t2;
  uint32_t t1;
  uint32_t h7;
  uint32_t g6;
  uint32_t f5;
  uint32_t e4;
  uint32_t d3;
  uint32_t c2;
  uint32_t b1;
  uint32_t a0;
  uint32_t w [64];
  uint32_t *h_local;
  uint8_t *msg_local;
  
  local_148 = 0;
  for (local_144 = 0; local_144 < 0x10; local_144 = local_144 + 1) {
    (&b1)[local_144] =
         (uint)msg[local_148] << 0x18 | (uint)msg[local_148 + 1] << 0x10 |
         (uint)msg[local_148 + 2] << 8 | (uint)msg[local_148 + 3];
    local_148 = local_148 + 4;
  }
  for (local_144 = 0x10; local_144 < 0x40; local_144 = local_144 + 1) {
    (&b1)[local_144] =
         (((&b1)[local_144 + -2] >> 0x11 | (&b1)[local_144 + -2] << 0xf) ^
          ((&b1)[local_144 + -2] >> 0x13 | (&b1)[local_144 + -2] << 0xd) ^
         (&b1)[local_144 + -2] >> 10) + (&b1)[local_144 + -7] +
         (((&b1)[local_144 + -0xf] >> 7 | (&b1)[local_144 + -0xf] << 0x19) ^
          ((&b1)[local_144 + -0xf] >> 0x12 | (&b1)[local_144 + -0xf] << 0xe) ^
         (&b1)[local_144 + -0xf] >> 3) + (&b1)[local_144 + -0x10];
  }
  c2 = *h;
  d3 = h[1];
  e4 = h[2];
  f5 = h[3];
  g6 = h[4];
  h7 = h[5];
  t1 = h[6];
  t2 = h[7];
  for (local_144 = 0; local_144 < 0x40; local_144 = local_144 + 1) {
    iVar1 = t2 + ((g6 >> 6 | g6 << 0x1a) ^ (g6 >> 0xb | g6 << 0x15) ^ (g6 >> 0x19 | g6 << 7)) +
            (g6 & h7 ^ (g6 ^ 0xffffffff) & t1) + k[local_144] + (&b1)[local_144];
    uVar2 = c2 & d3;
    uVar3 = c2 & e4;
    uVar4 = d3 & e4;
    t2 = t1;
    t1 = h7;
    h7 = g6;
    g6 = f5 + iVar1;
    f5 = e4;
    e4 = d3;
    d3 = c2;
    c2 = iVar1 + ((c2 >> 2 | c2 << 0x1e) ^ (c2 >> 0xd | c2 << 0x13) ^ (c2 >> 0x16 | c2 << 10)) +
                 (uVar2 ^ uVar3 ^ uVar4);
  }
  *h = c2 + *h;
  h[1] = d3 + h[1];
  h[2] = e4 + h[2];
  h[3] = f5 + h[3];
  h[4] = g6 + h[4];
  h[5] = h7 + h[5];
  h[6] = t1 + h[6];
  h[7] = t2 + h[7];
  return 0;
}

Assistant:

static int ztransform(const uint8_t *msg, uint32_t *h)
{
    uint32_t w[64];
    uint32_t a0, b1, c2, d3, e4, f5, g6, h7;
    uint32_t t1, t2;

    int i = 0;
    int j = 0;

    for (i=0; i<16; i++) {
        w[i] = msg[j]<<24 | msg[j+1]<<16 | msg[j+2]<<8 | msg[j+3];
        j += 4;
    }

    for(i=16; i<64; i++){
        w[i] = SSIG1(w[i-2])+w[i-7]+SSIG0(w[i-15])+w[i-16];
    }

    zdump_hex((uint8_t*)w, 64*4);

    a0 = h[0];
    b1 = h[1];
    c2 = h[2];
    d3 = h[3];
    e4 = h[4];
    f5 = h[5];
    g6 = h[6];
    h7 = h[7];

    for (i= 0; i<64; i++) {
        t1 = h7 + BSIG1(e4) + CHX(e4, f5, g6) + k[i] + w[i];
        t2 = BSIG0(a0) + MAJ(a0, b1, c2);

        h7 = g6;
        g6 = f5;
        f5 = e4;
        e4 = d3 + t1;
        d3 = c2;
        c2 = b1;
        b1 = a0;
        a0 = t1 + t2;
    }

    h[0] += a0;
    h[1] += b1;
    h[2] += c2;
    h[3] += d3;
    h[4] += e4;
    h[5] += f5;
    h[6] += g6;
    h[7] += h7;

    return 0;
}